

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O0

void __thiscall OpenMD::DirectionalAtom::setA(DirectionalAtom *this,RotMat3x3d *a)

{
  bool bVar1;
  Snapshot *pSVar2;
  Vector<double,_3U> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  RotMat3x3d atrans;
  AtomType *in_stack_fffffffffffffeb8;
  SquareMatrix3<double> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  SquareMatrix3<double> *in_stack_fffffffffffffef0;
  SquareMatrix3<double> *in_stack_fffffffffffffef8;
  AtomType *in_stack_ffffffffffffff00;
  
  pSVar2 = SnapshotManager::getCurrentSnapshot
                     ((SnapshotManager *)
                      (((SquareMatrix<double,_3> *)in_RDI->data_)->super_RectMatrix<double,_3U,_3U>)
                      .data_[1][0]);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)((long)&(pSVar2->atomData).aMat.
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                (long)(((SquareMatrix<double,_3> *)in_RDI->data_)->super_RectMatrix<double,_3U,_3U>)
                      .data_[0][2]),
             (long)*(int *)(((SquareMatrix<double,_3> *)in_RDI->data_)->
                           super_RectMatrix<double,_3U,_3U>).data_[2]);
  SquareMatrix3<double>::operator=
            (in_stack_fffffffffffffec0,(SquareMatrix3<double> *)in_stack_fffffffffffffeb8);
  bVar1 = AtomType::isMultipole(in_stack_ffffffffffffff00);
  if (bVar1) {
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_RDI);
    bVar1 = AtomType::isDipole(in_stack_fffffffffffffeb8);
    if (bVar1) {
      OpenMD::operator*(in_RDI,in_RSI);
      pSVar2 = SnapshotManager::getCurrentSnapshot((SnapshotManager *)in_RDI->data_[1][0]);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 ((long)&(pSVar2->atomData).dipole.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)in_RDI->data_[0][2]),
                 (long)*(int *)in_RDI->data_[2]);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (Vector<double,_3U> *)in_stack_fffffffffffffec0);
    }
    bVar1 = AtomType::isQuadrupole(in_stack_fffffffffffffeb8);
    if (bVar1) {
      OpenMD::operator*(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      OpenMD::operator*(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      pSVar2 = SnapshotManager::getCurrentSnapshot((SnapshotManager *)in_RDI->data_[1][0]);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)((long)&(pSVar2->atomData).quadrupole.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)in_RDI->data_[0][2]),
                 (long)*(int *)in_RDI->data_[2]);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)pSVar2,(SquareMatrix3<double> *)in_stack_fffffffffffffeb8)
      ;
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2be641);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2be64b);
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2be69d);
  }
  return;
}

Assistant:

void DirectionalAtom::setA(const RotMat3x3d& a) {
    ((snapshotMan_->getCurrentSnapshot())->*storage_).aMat[localIndex_] = a;

    if (atomType_->isMultipole()) {
      RotMat3x3d atrans = a.transpose();

      if (atomType_->isDipole()) {
        ((snapshotMan_->getCurrentSnapshot())->*storage_).dipole[localIndex_] =
            atrans * dipole_;
      }

      if (atomType_->isQuadrupole()) {
        ((snapshotMan_->getCurrentSnapshot())->*storage_)
            .quadrupole[localIndex_] = atrans * quadrupole_ * a;
      }
    }
  }